

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_utils.cc
# Opt level: O0

vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *
discoverWithFilter(DeviceFilter *filter)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  this;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *in_RDI;
  int in_stack_00000054;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *in_stack_00000058;
  DeviceInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> infos;
  time_point tend;
  time_point tstart;
  Discover discover;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *filtered_devices;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  *in_stack_fffffffffffffea0;
  Discover *this_00;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  in_stack_fffffffffffffea8;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  in_stack_fffffffffffffeb0;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *this_01;
  const_iterator __last;
  const_iterator in_stack_fffffffffffffec8;
  Discover *in_stack_fffffffffffffed0;
  __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
  local_f8;
  undefined1 *local_f0;
  undefined1 local_e1;
  DeviceInfo *local_e0;
  DeviceInfo *local_d8;
  DeviceFilter *in_stack_ffffffffffffff30;
  DeviceInfo *in_stack_ffffffffffffff38;
  Discover *in_stack_ffffffffffffff50;
  duration<double,_std::ratio<1L,_1000L>_> local_80;
  undefined1 local_78 [120];
  
  rcdiscover::Discover::Discover(in_stack_fffffffffffffed0);
  rcdiscover::Discover::broadcastRequest(in_stack_ffffffffffffff50);
  local_78._24_8_ = std::chrono::_V2::steady_clock::now();
  local_78._32_8_ = local_78._24_8_;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)0x13ac2c);
  while( true ) {
    bVar1 = rcdiscover::Discover::getResponse((Discover *)info,in_stack_00000058,in_stack_00000054);
    bVar2 = true;
    if (!bVar1) {
      std::chrono::operator-
                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffea8._M_current,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffea0);
      std::chrono::duration<double,std::ratio<1l,1000l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffeb0._M_current,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)
                 in_stack_fffffffffffffea8._M_current);
      in_stack_fffffffffffffec8._M_current =
           (DeviceInfo *)std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_80);
      bVar2 = (double)in_stack_fffffffffffffec8._M_current < 1000.0;
    }
    if (!bVar2) break;
    local_78._24_8_ = std::chrono::_V2::steady_clock::now();
  }
  __last._M_current = (DeviceInfo *)local_78;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::
  sort<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  this_01 = (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)local_78;
  iVar3 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  iVar4 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                    ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  this = std::
         unique<__gnu_cxx::__normal_iterator<rcdiscover::DeviceInfo*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>,discoverWithFilter(DeviceFilter_const&)::__0>
                   (iVar3._M_current,iVar4._M_current);
  __gnu_cxx::
  __normal_iterator<rcdiscover::DeviceInfo_const*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>
  ::__normal_iterator<rcdiscover::DeviceInfo*>
            (in_stack_fffffffffffffea0,
             (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  this_00 = (Discover *)local_78;
  local_d8 = (DeviceInfo *)
             std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                       ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                        CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  __gnu_cxx::
  __normal_iterator<rcdiscover::DeviceInfo_const*,std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>>
  ::__normal_iterator<rcdiscover::DeviceInfo*>
            ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)this_00,
             (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
              *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  iVar3 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::erase
                    (this._M_current,in_stack_fffffffffffffec8,__last);
  local_e1 = 0;
  local_e0 = iVar3._M_current;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::vector
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)0x13ae45);
  local_f0 = local_78;
  local_f8._M_current =
       (DeviceInfo *)
       std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::begin
                 ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                  CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
            ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                             *)this_00,
                            (__normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)), bVar2
        ) {
    __gnu_cxx::
    __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
    ::operator*(&local_f8);
    in_stack_fffffffffffffe9f = filterDevice(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if ((bool)in_stack_fffffffffffffe9f) {
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
                (this_01,iVar3._M_current);
    }
    __gnu_cxx::
    __normal_iterator<rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
    ::operator++(&local_f8);
  }
  local_e1 = 1;
  std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector(this_01);
  rcdiscover::Discover::~Discover(this_00);
  return in_RDI;
}

Assistant:

std::vector<rcdiscover::DeviceInfo> discoverWithFilter(
    const DeviceFilter &filter)
{
  rcdiscover::Discover discover;
  discover.broadcastRequest();

  std::chrono::steady_clock::time_point tstart=std::chrono::steady_clock::now();
  std::chrono::steady_clock::time_point tend=tstart;

  std::vector<rcdiscover::DeviceInfo> infos;
  while (discover.getResponse(infos, 100) ||
    std::chrono::duration<double, std::milli>(tend-tstart).count() < 1000)
  {
    tend=std::chrono::steady_clock::now();
  }

  std::sort(infos.begin(), infos.end());
  infos.erase(std::unique(infos.begin(), infos.end(),
                          [](const rcdiscover::DeviceInfo &lhs,
                             const rcdiscover::DeviceInfo &rhs)
                          {
                            return lhs.getMAC() == rhs.getMAC() &&
                                   lhs.getIfaceName() == rhs.getIfaceName();
                          }), infos.end());

  std::vector<rcdiscover::DeviceInfo> filtered_devices;
  for (const auto &info : infos)
  {
    if (filterDevice(info, filter))
    {
      filtered_devices.push_back(info);
    }
  }
  return filtered_devices;
}